

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O2

Node * __thiscall
mapbox::detail::Earcut<unsigned_int>::cureLocalIntersections(Earcut<unsigned_int> *this,Node *start)

{
  Node *p1;
  Node *q2;
  bool bVar1;
  Node *pNVar2;
  
  pNVar2 = start;
  do {
    p1 = pNVar2->prev;
    q2 = pNVar2->next->next;
    if ((p1->x != q2->x) || (NAN(p1->x) || NAN(q2->x))) {
LAB_00141208:
      bVar1 = intersects(this,p1,pNVar2,pNVar2->next,q2);
      if (((bVar1) && (bVar1 = locallyInside(this,p1,q2), bVar1)) &&
         (bVar1 = locallyInside(this,q2,p1), bVar1)) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)this,&p1->i);
        std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)this,&pNVar2->i);
        std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)this,&q2->i);
        removeNode(this,pNVar2);
        removeNode(this,pNVar2->next);
        start = q2;
        pNVar2 = q2;
      }
    }
    else if ((p1->y != q2->y) || (NAN(p1->y) || NAN(q2->y))) goto LAB_00141208;
    pNVar2 = pNVar2->next;
    if (pNVar2 == start) {
      pNVar2 = filterPoints(this,pNVar2,(Node *)0x0);
      return pNVar2;
    }
  } while( true );
}

Assistant:

typename Earcut<N>::Node*
Earcut<N>::cureLocalIntersections(Node* start) {
    Node* p = start;
    do {
        Node* a = p->prev;
        Node* b = p->next->next;

        // a self-intersection where edge (v[i-1],v[i]) intersects (v[i+1],v[i+2])
        if (!equals(a, b) && intersects(a, p, p->next, b) && locallyInside(a, b) && locallyInside(b, a)) {
            indices.emplace_back(a->i);
            indices.emplace_back(p->i);
            indices.emplace_back(b->i);

            // remove two nodes involved
            removeNode(p);
            removeNode(p->next);

            p = start = b;
        }
        p = p->next;
    } while (p != start);

    return filterPoints(p);
}